

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldAccessor::Swap
          (MapFieldAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,Field *other_data
          )

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *other;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_internal.h"
               ,0xeb);
    other = LogMessage::operator<<(&local_50,"CHECK failed: this == other_mutator: ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  this_00 = MapFieldBase::MutableRepeatedField((MapFieldBase *)data);
  other_00 = MapFieldBase::MutableRepeatedField((MapFieldBase *)other_data);
  if (this_00 != other_00) {
    if (other_00->arena_ == this_00->arena_) {
      pRVar2 = this_00->rep_;
      this_00->rep_ = other_00->rep_;
      other_00->rep_ = pRVar2;
      iVar1 = this_00->current_size_;
      this_00->current_size_ = other_00->current_size_;
      other_00->current_size_ = iVar1;
      iVar1 = this_00->total_size_;
      this_00->total_size_ = other_00->total_size_;
      other_00->total_size_ = iVar1;
    }
    else {
      RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                (this_00,other_00);
    }
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }